

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyDieRanges(DWARFVerifier *this,DWARFDie *Die,DieRangeInfo *ParentRI)

{
  char *pcVar1;
  undefined8 this_00;
  pointer pDVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  DWARFAbbreviationDeclaration *pDVar6;
  raw_ostream *prVar7;
  address_range_iterator R;
  die_range_info_iterator dVar8;
  size_t __n;
  size_t __n_00;
  void *__buf;
  void *__buf_00;
  uint uVar9;
  undefined1 in_R8B;
  undefined1 auVar10 [8];
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  DWARFDie DVar11;
  undefined1 local_f8 [8];
  DWARFDie Child;
  _Rb_tree<llvm::DWARFVerifier::DieRangeInfo,_llvm::DWARFVerifier::DieRangeInfo,_std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
  local_c0;
  undefined1 local_90 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  undefined1 local_68 [8];
  DWARFAddressRangesVector Ranges;
  undefined1 auStack_48 [8];
  DWARFAddressRange Range;
  
  uVar9 = 0;
  if ((Die->U != (DWARFUnit *)0x0) && (Die->Die != (DWARFDebugInfoEntry *)0x0)) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_90,Die);
    auVar10 = local_90;
    if ((RangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 local_68,(vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                           *)local_90);
      Child.Die = (DWARFDebugInfoEntry *)Die->U;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c0._M_impl.super__Rb_tree_header._M_header;
      uVar9 = 0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      RangesOrError._24_8_ = Die;
      Ranges.super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ParentRI;
      if (((((this->IsObjectFile != true) || (this->IsMachOObject != false)) ||
           (pDVar6 = DWARFDie::getAbbreviationDeclarationPtr(Die),
           pDVar6 == (DWARFAbbreviationDeclaration *)0x0)) || (pDVar6->Tag != DW_TAG_compile_unit))
         && (pDVar2 = Ranges.
                      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            local_68 !=
            (undefined1  [8])
            Ranges.
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
        uVar9 = 0;
        auVar10 = local_68;
        do {
          auStack_48 = (undefined1  [8])((pointer)auVar10)->LowPC;
          Range.LowPC = ((pointer)auVar10)->HighPC;
          Range.HighPC = ((pointer)auVar10)->SectionIndex;
          if ((DWARFUnit *)((pointer)auVar10)->HighPC < (DWARFUnit *)((pointer)auVar10)->LowPC) {
            prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            Str.Length = 0x16;
            Str.Data = "Invalid address range ";
            prVar7 = raw_ostream::operator<<(prVar7,Str);
            prVar7 = llvm::operator<<(prVar7,(DWARFAddressRange *)auStack_48);
            Str_00.Length = 1;
            Str_00.Data = "\n";
            raw_ostream::operator<<(prVar7,Str_00);
            uVar9 = uVar9 + 1;
            iVar4 = 3;
          }
          else {
            R = DieRangeInfo::insert((DieRangeInfo *)&Child.Die,(DWARFAddressRange *)auStack_48);
            if (R._M_current == (DWARFAddressRange *)0x0) {
              iVar4 = 0;
            }
            else {
              prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              Str_01.Length = 0x24;
              Str_01.Data = "DIE has overlapping address ranges: ";
              prVar7 = raw_ostream::operator<<(prVar7,Str_01);
              prVar7 = llvm::operator<<(prVar7,(DWARFAddressRange *)auStack_48);
              Str_02.Length = 5;
              Str_02.Data = " and ";
              prVar7 = raw_ostream::operator<<(prVar7,Str_02);
              prVar7 = llvm::operator<<(prVar7,R._M_current);
              Str_03.Length = 1;
              Str_03.Data = "\n";
              raw_ostream::operator<<(prVar7,Str_03);
              uVar9 = uVar9 + 1;
              iVar4 = 2;
            }
          }
        } while (((iVar4 == 3) || (iVar4 == 0)) &&
                (auVar10 = (undefined1  [8])((long)auVar10 + 0x18),
                auVar10 != (undefined1  [8])pDVar2));
      }
      dVar8 = DieRangeInfo::insert
                        ((DieRangeInfo *)
                         Ranges.
                         super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (DieRangeInfo *)&Child.Die);
      this_00 = RangesOrError._24_8_;
      if (dVar8._M_node !=
          (_Base_ptr)
          (Ranges.
           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2)) {
        prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_04.Length = 0x25;
        Str_04.Data = "DIEs have overlapping address ranges:";
        raw_ostream::operator<<(prVar7,Str_04);
        DWARFDie::dump((DWARFDie *)this_00,this->OS,0,this->DumpOpts);
        __n._0_1_ = (this->DumpOpts).ShowChildren;
        __n._1_1_ = (this->DumpOpts).ShowParents;
        __n._2_1_ = (this->DumpOpts).ShowForm;
        __n._3_1_ = (this->DumpOpts).SummarizeTypes;
        __n._4_1_ = (this->DumpOpts).Verbose;
        __n._5_1_ = (this->DumpOpts).DisplayRawContents;
        __n._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
        DWARFDie::dump((DWARFDie *)(dVar8._M_node + 1),this->OS,0,this->DumpOpts);
        uVar9 = uVar9 + 1;
        prVar7 = this->OS;
        pcVar1 = prVar7->OutBufCur;
        if (pcVar1 < prVar7->OutBufEnd) {
          prVar7->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\n';
        }
        else {
          raw_ostream::write(prVar7,10,__buf,__n);
        }
      }
      pDVar2 = Ranges.
               super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((((local_68 !=
             (undefined1  [8])
             Ranges.
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
             _M_impl.super__Vector_impl_data._M_start) &&
           ((Ranges.
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage)->SectionIndex !=
            Ranges.
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[1].LowPC)) &&
          ((pDVar6 = DWARFDie::getAbbreviationDeclarationPtr((DWARFDie *)this_00),
           pDVar6 == (DWARFAbbreviationDeclaration *)0x0 ||
           (((pDVar6->Tag != DW_TAG_subprogram ||
             (pDVar6 = DWARFDie::getAbbreviationDeclarationPtr((DWARFDie *)pDVar2),
             pDVar6 == (DWARFAbbreviationDeclaration *)0x0)) || (pDVar6->Tag != DW_TAG_subprogram)))
           ))) && (bVar3 = DieRangeInfo::contains((DieRangeInfo *)pDVar2,(DieRangeInfo *)&Child.Die)
                  , !bVar3)) {
        prVar7 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbe8acc,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_05.Length = 0x3c;
        Str_05.Data = "DIE address ranges are not contained in its parent\'s ranges:";
        raw_ostream::operator<<(prVar7,Str_05);
        DWARFDie::dump((DWARFDie *)pDVar2,this->OS,0,this->DumpOpts);
        __n_00._0_1_ = (this->DumpOpts).ShowChildren;
        __n_00._1_1_ = (this->DumpOpts).ShowParents;
        __n_00._2_1_ = (this->DumpOpts).ShowForm;
        __n_00._3_1_ = (this->DumpOpts).SummarizeTypes;
        __n_00._4_1_ = (this->DumpOpts).Verbose;
        __n_00._5_1_ = (this->DumpOpts).DisplayRawContents;
        __n_00._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
        DWARFDie::dump((DWARFDie *)this_00,this->OS,2,this->DumpOpts);
        uVar9 = uVar9 + 1;
        prVar7 = this->OS;
        pcVar1 = prVar7->OutBufCur;
        if (pcVar1 < prVar7->OutBufEnd) {
          prVar7->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\n';
        }
        else {
          raw_ostream::write(prVar7,10,__buf_00,__n_00);
        }
      }
      _auStack_48 = DWARFDie::getFirstChild((DWARFDie *)this_00);
      DVar11 = DWARFDie::getLastChild((DWARFDie *)this_00);
      if (((DWARFDebugInfoEntry *)Range.LowPC != DVar11.Die) ||
         (auStack_48 != (undefined1  [8])DVar11.U)) {
        do {
          local_f8 = auStack_48;
          Child.U = (DWARFUnit *)Range.LowPC;
          uVar5 = verifyDieRanges(this,(DWARFDie *)local_f8,(DieRangeInfo *)&Child.Die);
          _auStack_48 = DWARFDie::getSibling((DWARFDie *)auStack_48);
          uVar9 = uVar9 + uVar5;
        } while (SUB168((undefined1  [16])DVar11 ^ (undefined1  [16])_auStack_48,0) != 0 ||
                 SUB168((undefined1  [16])DVar11 ^ (undefined1  [16])_auStack_48,8) != 0);
      }
      std::
      _Rb_tree<llvm::DWARFVerifier::DieRangeInfo,_llvm::DWARFVerifier::DieRangeInfo,_std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
      ::~_Rb_tree(&local_c0);
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68,
                        (long)Ranges.
                              super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
      }
    }
    else {
      local_90[0] = '\0';
      local_90[1] = '\0';
      local_90[2] = '\0';
      local_90[3] = '\0';
      local_90[4] = '\0';
      local_90[5] = '\0';
      local_90[6] = '\0';
      local_90[7] = '\0';
      Child.Die = (DWARFDebugInfoEntry *)((ulong)auVar10 | 1);
      handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                ((Error *)&Child.Die,(anon_class_1_0_00000001 *)local_68);
      if ((long *)((ulong)Child.Die & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)Child.Die & 0xfffffffffffffffe) + 8))();
      }
      uVar9 = 1;
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_90);
  }
  return uVar9;
}

Assistant:

unsigned DWARFVerifier::verifyDieRanges(const DWARFDie &Die,
                                        DieRangeInfo &ParentRI) {
  unsigned NumErrors = 0;

  if (!Die.isValid())
    return NumErrors;

  auto RangesOrError = Die.getAddressRanges();
  if (!RangesOrError) {
    // FIXME: Report the error.
    ++NumErrors;
    llvm::consumeError(RangesOrError.takeError());
    return NumErrors;
  }

  DWARFAddressRangesVector Ranges = RangesOrError.get();
  // Build RI for this DIE and check that ranges within this DIE do not
  // overlap.
  DieRangeInfo RI(Die);

  // TODO support object files better
  //
  // Some object file formats (i.e. non-MachO) support COMDAT.  ELF in
  // particular does so by placing each function into a section.  The DWARF data
  // for the function at that point uses a section relative DW_FORM_addrp for
  // the DW_AT_low_pc and a DW_FORM_data4 for the offset as the DW_AT_high_pc.
  // In such a case, when the Die is the CU, the ranges will overlap, and we
  // will flag valid conflicting ranges as invalid.
  //
  // For such targets, we should read the ranges from the CU and partition them
  // by the section id.  The ranges within a particular section should be
  // disjoint, although the ranges across sections may overlap.  We would map
  // the child die to the entity that it references and the section with which
  // it is associated.  The child would then be checked against the range
  // information for the associated section.
  //
  // For now, simply elide the range verification for the CU DIEs if we are
  // processing an object file.

  if (!IsObjectFile || IsMachOObject || Die.getTag() != DW_TAG_compile_unit) {
    for (auto Range : Ranges) {
      if (!Range.valid()) {
        ++NumErrors;
        error() << "Invalid address range " << Range << "\n";
        continue;
      }

      // Verify that ranges don't intersect.
      const auto IntersectingRange = RI.insert(Range);
      if (IntersectingRange != RI.Ranges.end()) {
        ++NumErrors;
        error() << "DIE has overlapping address ranges: " << Range << " and "
                << *IntersectingRange << "\n";
        break;
      }
    }
  }

  // Verify that children don't intersect.
  const auto IntersectingChild = ParentRI.insert(RI);
  if (IntersectingChild != ParentRI.Children.end()) {
    ++NumErrors;
    error() << "DIEs have overlapping address ranges:";
    dump(Die);
    dump(IntersectingChild->Die) << '\n';
  }

  // Verify that ranges are contained within their parent.
  bool ShouldBeContained = !Ranges.empty() && !ParentRI.Ranges.empty() &&
                           !(Die.getTag() == DW_TAG_subprogram &&
                             ParentRI.Die.getTag() == DW_TAG_subprogram);
  if (ShouldBeContained && !ParentRI.contains(RI)) {
    ++NumErrors;
    error() << "DIE address ranges are not contained in its parent's ranges:";
    dump(ParentRI.Die);
    dump(Die, 2) << '\n';
  }

  // Recursively check children.
  for (DWARFDie Child : Die)
    NumErrors += verifyDieRanges(Child, RI);

  return NumErrors;
}